

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::UnionNodes
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,Node *prev,Node *curr)

{
  NodeTag *pNVar1;
  Node *pNVar2;
  MatchCharNode *currChar;
  
  if (prev->tag == MatchSet) {
    if (*(char *)&prev[1]._vptr_Node == '\0') {
      if (curr->tag == MatchSet) {
        if (*(char *)&curr[1]._vptr_Node == '\0') {
          CharSet<char16_t>::UnionInPlace
                    ((CharSet<char16_t> *)&prev[1].tag,this->ctAllocator,
                     (CharSet<char16_t> *)&curr[1].tag);
          return prev;
        }
      }
      else if (curr->tag == MatchChar) {
        CharSet<char16_t>::SetRange
                  ((CharSet<char16_t> *)&prev[1].tag,this->ctAllocator,*(Char *)&curr[1]._vptr_Node,
                   *(Char *)&curr[1]._vptr_Node);
        return prev;
      }
    }
  }
  else if (prev->tag == MatchChar) {
    if (curr->tag == MatchSet) {
      if (*(char *)&curr[1]._vptr_Node == '\0') {
        pNVar2 = (Node *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee);
        pNVar2->tag = MatchSet;
        pNVar2->features = 0;
        *(uint *)&pNVar2->field_0xc = *(uint *)&pNVar2->field_0xc & 0xffff8000;
        pNVar2->firstSet = (CharSet<char16_t> *)0x0;
        pNVar2->followSet = (CharSet<char16_t> *)0x0;
        (pNVar2->prevConsumes).lower = 0;
        *(undefined8 *)&(pNVar2->prevConsumes).upper = 0xffffffff;
        *(undefined8 *)&(pNVar2->thisConsumes).upper = 0xffffffff;
        (pNVar2->followConsumes).upper = 0xffffffff;
        pNVar2->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
        *(undefined2 *)&pNVar2[1]._vptr_Node = 0x100;
        pNVar1 = &pNVar2[1].tag;
        CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar1);
        CharSet<char16_t>::SetRange
                  ((CharSet<char16_t> *)pNVar1,this->ctAllocator,*(Char *)&prev[1]._vptr_Node,
                   *(Char *)&prev[1]._vptr_Node);
        CharSet<char16_t>::UnionInPlace
                  ((CharSet<char16_t> *)pNVar1,this->ctAllocator,(CharSet<char16_t> *)&curr[1].tag);
        return pNVar2;
      }
    }
    else if (curr->tag == MatchChar) {
      if (*(short *)&prev[1]._vptr_Node == *(short *)&curr[1]._vptr_Node) {
        return prev;
      }
      pNVar2 = (Node *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x366bee);
      pNVar2->tag = MatchSet;
      pNVar2->features = 0;
      *(uint *)&pNVar2->field_0xc = *(uint *)&pNVar2->field_0xc & 0xffff8000;
      pNVar2->firstSet = (CharSet<char16_t> *)0x0;
      pNVar2->followSet = (CharSet<char16_t> *)0x0;
      (pNVar2->prevConsumes).lower = 0;
      *(undefined8 *)&(pNVar2->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(pNVar2->thisConsumes).upper = 0xffffffff;
      (pNVar2->followConsumes).upper = 0xffffffff;
      pNVar2->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
      *(undefined2 *)&pNVar2[1]._vptr_Node = 0x100;
      pNVar1 = &pNVar2[1].tag;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar1);
      CharSet<char16_t>::SetRange
                ((CharSet<char16_t> *)pNVar1,this->ctAllocator,*(Char *)&prev[1]._vptr_Node,
                 *(Char *)&prev[1]._vptr_Node);
      CharSet<char16_t>::SetRange
                ((CharSet<char16_t> *)pNVar1,this->ctAllocator,*(Char *)&curr[1]._vptr_Node,
                 *(Char *)&curr[1]._vptr_Node);
      return pNVar2;
    }
  }
  return (Node *)0x0;
}

Assistant:

Node* Parser<P, IsLiteral>::UnionNodes(Node* prev, Node* curr)
    {
        if (prev->tag == Node::MatchChar)
        {
            MatchCharNode* prevChar = (MatchCharNode*)prev;
            if (curr->tag == Node::MatchChar)
            {
                MatchCharNode* currChar = (MatchCharNode*)curr;
                if (prevChar->cs[0] == currChar->cs[0])
                    // Just ignore current node
                    return prevChar;
                else
                {
                    // Union chars into new set
                    MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false);
                    setNode->set.Set(ctAllocator, prevChar->cs[0]);
                    setNode->set.Set(ctAllocator, currChar->cs[0]);
                    return setNode;
                }
            }
            else if (curr->tag == Node::MatchSet)
            {
                MatchSetNode* currSet = (MatchSetNode*)curr;
                if (currSet->isNegation)
                    // Can't merge
                    return 0;
                else
                {
                    // Union chars into new set
                    MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false);
                    setNode->set.Set(ctAllocator, prevChar->cs[0]) ;
                    setNode->set.UnionInPlace(ctAllocator, currSet->set);
                    return setNode;
                }
            }
            else
                // Can't merge
                return 0;
        }
        else if (prev->tag == Node::MatchSet)
        {
            MatchSetNode* prevSet = (MatchSetNode*)prev;
            if (prevSet->isNegation)
                // Can't merge
                return 0;
            else if (curr->tag == Node::MatchChar)
            {
                MatchCharNode* currChar = (MatchCharNode*)curr;
                // Include char in prev set
                prevSet->set.Set(ctAllocator, currChar->cs[0]);
                return prevSet;
            }
            else if (curr->tag == Node::MatchSet)
            {
                MatchSetNode* currSet = (MatchSetNode*)curr;
                if (currSet->isNegation)
                    // Can't merge
                    return 0;
                else
                {
                    // Include chars in prev set
                    prevSet->set.UnionInPlace(ctAllocator, currSet->set);
                    return prevSet;
                }
            }
            else
                // Can't merge
                return 0;
        }
        else
            // Can't merge
            return 0;
    }